

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_copy_from_window(lzh_stream *strm,lzh_dec *ds)

{
  long in_RSI;
  long in_RDI;
  size_t copy_bytes;
  size_t local_20;
  wchar_t local_4;
  
  if ((*(int *)(in_RSI + 0x24) == 0) && (0 < *(int *)(in_RSI + 0x18))) {
    if (*(long *)(in_RDI + 0x20) < (long)(*(int *)(in_RSI + 0x18) - *(int *)(in_RSI + 0x1c))) {
      local_20 = *(size_t *)(in_RDI + 0x20);
    }
    else {
      local_20 = (size_t)(*(int *)(in_RSI + 0x18) - *(int *)(in_RSI + 0x1c));
    }
    memcpy(*(void **)(in_RDI + 0x18),
           (void *)(*(long *)(in_RSI + 0x10) + (long)*(int *)(in_RSI + 0x1c)),local_20);
    *(int *)(in_RSI + 0x1c) = (int)local_20 + *(int *)(in_RSI + 0x1c);
  }
  else {
    if (*(long *)(in_RDI + 0x20) < (long)*(int *)(in_RSI + 0x24)) {
      local_20 = *(size_t *)(in_RDI + 0x20);
    }
    else {
      local_20 = (size_t)*(int *)(in_RSI + 0x24);
    }
    memcpy(*(void **)(in_RDI + 0x18),
           (void *)((*(long *)(in_RSI + 0x10) + (long)*(int *)(in_RSI + 4)) -
                   (long)*(int *)(in_RSI + 0x24)),local_20);
    *(int *)(in_RSI + 0x24) = *(int *)(in_RSI + 0x24) - (int)local_20;
  }
  *(size_t *)(in_RDI + 0x18) = local_20 + *(long *)(in_RDI + 0x18);
  *(size_t *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - local_20;
  *(size_t *)(in_RDI + 0x28) = local_20 + *(long *)(in_RDI + 0x28);
  local_4 = (wchar_t)(*(long *)(in_RDI + 0x20) != 0);
  return local_4;
}

Assistant:

static int
lzh_copy_from_window(struct lzh_stream *strm, struct lzh_dec *ds)
{
	size_t copy_bytes;

	if (ds->w_remaining == 0 && ds->w_pos > 0) {
		if (ds->w_pos - ds->copy_pos <= strm->avail_out)
			copy_bytes = ds->w_pos - ds->copy_pos;
		else
			copy_bytes = (size_t)strm->avail_out;
		memcpy(strm->next_out,
		    ds->w_buff + ds->copy_pos, copy_bytes);
		ds->copy_pos += (int)copy_bytes;
	} else {
		if (ds->w_remaining <= strm->avail_out)
			copy_bytes = ds->w_remaining;
		else
			copy_bytes = (size_t)strm->avail_out;
		memcpy(strm->next_out,
		    ds->w_buff + ds->w_size - ds->w_remaining, copy_bytes);
		ds->w_remaining -= (int)copy_bytes;
	}
	strm->next_out += copy_bytes;
	strm->avail_out -= copy_bytes;
	strm->total_out += copy_bytes;
	if (strm->avail_out == 0)
		return (0);
	else
		return (1);
}